

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recommend.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  typed_value<int,_char> *ptVar3;
  vw *this;
  example *ec;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  size_type sVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined8 uVar8;
  int *piVar9;
  void *pvVar10;
  vw *pvVar11;
  size_t sVar12;
  size_type sVar13;
  const_reference pvVar14;
  string str;
  example *ex;
  char *estr;
  vw *model;
  char *bf;
  ssize_t read;
  size_t len;
  char *i;
  char *u;
  char *buf;
  FILE *fI;
  FILE *fU;
  FILE *fB;
  exception *e;
  options_description desc;
  variables_map vm;
  char *in_stack_fffffffffffffa98;
  char *in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  const_reference in_stack_fffffffffffffab0;
  value_type *in_stack_fffffffffffffab8;
  ostream *in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  const_reference in_stack_fffffffffffffad8;
  void *in_stack_fffffffffffffaf0;
  allocator *paVar15;
  trace_message_t in_stack_fffffffffffffaf8;
  undefined8 in_stack_fffffffffffffb00;
  undefined1 skipModelLoad;
  string *this_00;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  string *in_stack_fffffffffffffb10;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  FILE *pFVar16;
  options_description *in_stack_fffffffffffffb88;
  char **in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  int argc_00;
  undefined1 in_stack_fffffffffffffc0f;
  vw *in_stack_fffffffffffffc10;
  allocator local_2f9;
  string local_2f8 [32];
  example *local_2d8;
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [32];
  string local_280 [32];
  char *local_260;
  string local_258 [32];
  vw *local_238;
  char *local_230;
  __ssize_t local_228;
  size_t local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  FILE *local_200;
  FILE *local_1f8;
  FILE *local_1f0;
  allocator local_1e1;
  string local_1e0 [40];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  basic_parsed_options local_198 [40];
  undefined8 local_170 [3];
  allocator local_151;
  string local_150 [32];
  options_description local_130 [128];
  variables_map local_b0 [172];
  int local_4;
  
  argc_00 = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  iVar1 = (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  local_4 = 0;
  boost::program_options::variables_map::variables_map(local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"Allowed options",&local_151);
  boost::program_options::options_description::options_description
            (local_130,local_150,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  local_170[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_170,"help,h");
  ptVar3 = boost::program_options::value<int>((int *)in_stack_fffffffffffffab0);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"topk",(char *)ptVar3);
  ptVar3 = boost::program_options::value<int>((int *)in_stack_fffffffffffffab0);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"verbose,v",(char *)ptVar3);
  this = (vw *)boost::program_options::value<int>((int *)in_stack_fffffffffffffab0);
  ec = (example *)
       boost::program_options::options_description_easy_init::operator()
                 (pcVar2,(value_semantic *)"bf_bits,b",(char *)this);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffab0);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)ec,(value_semantic *)"blacklist,B",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffab0);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"users,U",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffab0);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"items,I",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffab0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"vwparams",(char *)ptVar4);
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x11a376);
  boost::program_options::parse_command_line<char>
            (argc_00,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,iVar1,
             in_stack_fffffffffffffb78);
  boost::program_options::store(local_198,local_b0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x11a3cf);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x11a3dc);
  boost::program_options::notify(local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"help",&local_1e1);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_fffffffffffffab0,(key_type *)in_stack_fffffffffffffaa8);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  if (sVar5 != 0) {
    poVar6 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_130);
    std::operator<<(poVar6,"\n");
    local_4 = 1;
    boost::program_options::options_description::~options_description
              ((options_description *)in_stack_fffffffffffffaa0);
    boost::program_options::variables_map::~variables_map
              ((variables_map *)in_stack_fffffffffffffaa0);
    return local_4;
  }
  uVar7 = std::__cxx11::string::empty();
  if (((((uVar7 & 1) != 0) || (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) ||
      (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) ||
     (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) {
    poVar6 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_130);
    std::operator<<(poVar6,"\n");
    exit(2);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_1f0 = fopen64(pcVar2,"r");
  pFVar16 = _stderr;
  if (local_1f0 == (FILE *)0x0) {
    uVar8 = std::__cxx11::string::c_str();
    piVar9 = __errno_location();
    pcVar2 = strerror(*piVar9);
    fprintf(pFVar16,"can\'t open %s: %s\n",uVar8,pcVar2);
    pvVar10 = (void *)boost::program_options::operator<<((ostream *)&std::cerr,local_130);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_1f8 = fopen64(pcVar2,"r");
  if (local_1f8 != (FILE *)0x0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_200 = fopen64(pcVar2,"r");
    pFVar16 = _stderr;
    if (local_200 != (FILE *)0x0) {
      local_208 = (char *)0x0;
      local_210 = (char *)0x0;
      local_218 = (char *)0x0;
      local_220 = 0;
      if (0 < verbose) {
        fprintf(_stderr,"loading blacklist into bloom filter...\n");
      }
      local_230 = bf_new((uint)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
      while( true ) {
        local_228 = getline(&local_208,&local_220,local_1f0);
        skipModelLoad = (undefined1)((ulong)in_stack_fffffffffffffb00 >> 0x38);
        if (local_228 == -1) break;
        bf_add((char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
        banned = banned + 1;
      }
      if (verbose != 0) {
        bf_info(in_stack_fffffffffffffaa0,(FILE *)in_stack_fffffffffffffa98);
        fprintf(_stderr,"%d banned pairs\n",(ulong)(uint)banned);
      }
      if (0 < verbose) {
        fprintf(_stderr,"initializing vw...\n");
      }
      std::__cxx11::string::string(local_258,(string *)&vwparams_abi_cxx11_);
      pvVar11 = VW::initialize(in_stack_fffffffffffffb10,
                               (io_buf *)
                               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                               (bool)skipModelLoad,in_stack_fffffffffffffaf8,
                               in_stack_fffffffffffffaf0);
      std::__cxx11::string::~string(local_258);
      local_260 = (char *)0x0;
      local_238 = pvVar11;
      if (0 < verbose) {
        fprintf(_stderr,"predicting...\n");
        in_stack_fffffffffffffa98 = "skipped";
        in_stack_fffffffffffffaa0 = "userfile";
        in_stack_fffffffffffffaa8 = "itemfile";
        fprintf(_stderr,"%12s %8s %8s %8s %12s %s %s\n","pair","user","item","rec");
      }
      while (local_228 = getline(&local_210,&local_220,local_1f8), pcVar2 = local_210,
            local_228 != -1) {
        users = users + 1;
        sVar12 = strlen(local_210);
        pcVar2[sVar12 - 1] = '\0';
        rewind(local_200);
        items = 0;
        while (local_228 = getline(&local_218,&local_220,local_200), local_228 != -1) {
          items = items + 1;
          pairs = pairs + 1;
          if (0 < verbose && pairs % show == 0) {
            progress();
            show = show << 1;
          }
          free(local_260);
          pcVar2 = local_210;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2a0,pcVar2,&local_2a1);
          pcVar2 = local_218;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2c8,pcVar2,&local_2c9);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffad8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0));
          this_00 = local_280;
          pcVar2 = (char *)std::__cxx11::string::c_str();
          local_260 = strdup(pcVar2);
          std::__cxx11::string::~string(this_00);
          std::__cxx11::string::~string(local_2c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
          std::__cxx11::string::~string(local_2a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
          iVar1 = bf_hit((char *)in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0);
          if (iVar1 == 0) {
            local_2d8 = VW::read_example((vw *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
            vw::learn(this,ec);
            pcVar2 = local_260;
            paVar15 = &local_2f9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2f8,pcVar2,paVar15);
            std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
            sVar13 = std::
                     priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                     ::size((priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                             *)0x11af56);
            if (sVar13 < (ulong)(long)topk) {
              std::make_pair<float&,std::__cxx11::string_const&>
                        ((float *)in_stack_fffffffffffffaa8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffaa0);
              std::
              priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
              ::push((priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                      *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
              std::
              pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x11afbb);
            }
            else {
              in_stack_fffffffffffffad8 =
                   std::
                   priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                   ::top((priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                          *)0x11b0aa);
              if (in_stack_fffffffffffffad8->first < (local_2d8->pred).scalar) {
                std::
                priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                ::pop((priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                       *)in_stack_fffffffffffffab0);
                std::make_pair<float&,std::__cxx11::string_const&>
                          ((float *)in_stack_fffffffffffffaa8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0);
                std::
                priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                ::push((priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                        *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
                std::
                pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x11b126);
              }
            }
            VW::finish_example((vw *)in_stack_fffffffffffffaa0,(example *)in_stack_fffffffffffffa98)
            ;
            std::__cxx11::string::~string(local_2f8);
          }
          else {
            skipped = skipped + 1;
            if (1 < verbose) {
              fprintf(_stderr,"skipping:#%s#\n",local_260);
            }
          }
        }
        local_228 = -1;
        while (in_stack_fffffffffffffad7 =
                    std::
                    priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                    ::empty((priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                             *)0x11b1d2), ((in_stack_fffffffffffffad7 ^ 0xff) & 1) != 0) {
          pvVar14 = std::
                    priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                    ::top((priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                           *)0x11b1f3);
          in_stack_fffffffffffffac0 = (ostream *)std::ostream::operator<<(&std::cout,pvVar14->first)
          ;
          in_stack_fffffffffffffab8 = (value_type *)std::operator<<(in_stack_fffffffffffffac0,"\t");
          in_stack_fffffffffffffab0 =
               std::
               priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
               ::top((priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                      *)0x11b23a);
          std::operator<<((ostream *)in_stack_fffffffffffffab8,
                          (string *)&in_stack_fffffffffffffab0->second);
          std::
          priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
          ::pop((priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                 *)in_stack_fffffffffffffab0);
          recs = recs + 1;
        }
      }
      if (0 < verbose) {
        progress();
      }
      VW::finish(in_stack_fffffffffffffc10,(bool)in_stack_fffffffffffffc0f);
      fclose(local_200);
      fclose(local_1f8);
      exit(0);
    }
    uVar8 = std::__cxx11::string::c_str();
    piVar9 = __errno_location();
    pcVar2 = strerror(*piVar9);
    fprintf(pFVar16,"can\'t open %s: %s\n",uVar8,pcVar2);
    pvVar10 = (void *)boost::program_options::operator<<((ostream *)&std::cerr,local_130);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  pFVar16 = _stderr;
  uVar8 = std::__cxx11::string::c_str();
  piVar9 = __errno_location();
  pcVar2 = strerror(*piVar9);
  fprintf(pFVar16,"can\'t open %s: %s\n",uVar8,pcVar2);
  pvVar10 = (void *)boost::program_options::operator<<((ostream *)&std::cerr,local_130);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

int main(int argc, char *argv[])
{ po::variables_map vm;
  po::options_description desc("Allowed options");
  desc.add_options()
  ("help,h", "produce help message")
  ("topk", po::value<int>(&topk), "number of items to recommend per user")
  ("verbose,v", po::value<int>(&verbose), "increase verbosity (can be repeated)")
  ("bf_bits,b", po::value<int>(&b), "number of items to recommend")
  ("blacklist,B", po::value<string>(&blacklistfilename), "user item pairs (in vw format) that we should not recommend (have been seen before)")
  ("users,U", po::value<string>(&userfilename), "users portion in vw format to make recs for")
  ("items,I", po::value<string>(&itemfilename), "items (in vw format) to recommend from")
  ("vwparams", po::value<string>(&vwparams), "vw parameters for model instantiation (-i model ...)")
  ;

  try
  { po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);
  }
  catch(exception & e)
  { cout << endl << argv[0] << ": " << e.what() << endl << endl << desc << endl;
    exit(2);
  }

  if (vm.count("help"))
  { cout << desc << "\n";
    return 1;
  }

  if (blacklistfilename.empty() || userfilename.empty() || itemfilename.empty() || vwparams.empty())
  { cout << desc << "\n";
    exit(2);
  }

  FILE * fB;
  FILE * fU;
  FILE * fI;

  if((fB = fopen(blacklistfilename.c_str(), "r")) == NULL)
  { fprintf(stderr,"can't open %s: %s\n", blacklistfilename.c_str(), strerror(errno));
    cerr << desc << endl;
    exit(2);
  }
  if((fU = fopen(userfilename.c_str(), "r")) == NULL )
  { fprintf(stderr,"can't open %s: %s\n", userfilename.c_str(), strerror(errno));
    cerr << desc << endl;
    exit(2);
  }
  if((fI = fopen(itemfilename.c_str(), "r")) == NULL )
  { fprintf(stderr,"can't open %s: %s\n", itemfilename.c_str(), strerror(errno));
    cerr << desc << endl;
    exit(2);
  }

  char * buf = NULL;
  char * u = NULL;
  char * i = NULL;
  size_t len = 0;
  ssize_t read;

  /* make the bloom filter */
  if(verbose>0)
    fprintf(stderr, "loading blacklist into bloom filter...\n");
  char *bf= bf_new(b);

  /* loop over the source file */
  while ((read = getline(&buf,&len,fB)) != -1)
  { bf_add(bf,buf);
    banned++;
  }

  /* print saturation etc */
  if (verbose)
  { bf_info(bf,stderr);
    fprintf(stderr, "%d banned pairs\n", banned);
  }

  // INITIALIZE WITH WHATEVER YOU WOULD PUT ON THE VW COMMAND LINE
  if(verbose>0)
    fprintf(stderr, "initializing vw...\n");
  vw* model = VW::initialize(vwparams);

  char * estr = NULL;

  if(verbose>0)
  { fprintf(stderr, "predicting...\n");
    fprintf(stderr, "%12s %8s %8s %8s %12s %s %s\n", "pair", "user", "item", "rec", "skipped", "userfile", "itemfile");
  }
  while ((read = getline(&u, &len, fU)) != -1)
  { users++;
    u[strlen(u)-1] = 0; // chop
    rewind(fI);
    items=0;
    while ((read = getline(&i, &len, fI)) != -1)
    { items++;
      pairs++;

      if((verbose > 0) & (pairs % show == 0))
      { progress();
        show *= 2;
      }

      free(estr);
      estr = strdup((string(u)+string(i)).c_str());

      if (!bf_hit(bf,estr))
      { example *ex = VW::read_example(*model, estr);
        model->learn(*ex);

        const string str(estr);

        if(pr_queue.size() < (size_t)topk)
        { pr_queue.push(make_pair(ex->pred.scalar, str));
        }
        else if(pr_queue.top().first < ex->pred.scalar)
        { pr_queue.pop();
          pr_queue.push(make_pair(ex->pred.scalar, str));
        }

        VW::finish_example(*model, *ex);
      }
      else
      { skipped++;
        if(verbose>=2)
          fprintf(stderr,"skipping:#%s#\n", estr);
      }

    }

    while(!pr_queue.empty())
    { cout << pr_queue.top().first << "\t" << pr_queue.top().second;
      pr_queue.pop();
      recs++;
    }
  }
  if(verbose>0)
  { progress();
  }

  VW::finish(*model);
  fclose(fI);
  fclose(fU);
  exit(EXIT_SUCCESS);

}